

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle,file_status_t *status)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  file_status_t *__src;
  long alStackY_600 [8];
  char local_5b8 [8];
  char filename [1024];
  fdb_config config;
  bid_t stale_root_bid;
  bid_t seq_root_bid;
  bid_t trie_root_bid;
  uint8_t *buf;
  char *new_filename;
  size_t header_len;
  uint64_t header_flags;
  uint64_t kv_info_offset;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t nlivenodes;
  uint64_t datasize;
  uint64_t ndeletes;
  uint64_t ndocs;
  fdb_status local_50;
  file_status_t fstatus;
  fdb_status fs;
  bool fhandle_ret;
  file_status_t *status_local;
  fdb_kvs_handle *handle_local;
  
  local_50 = FDB_RESULT_SUCCESS;
  _fs = status;
  status_local = (file_status_t *)handle;
  ndocs._7_1_ = filemgr_get_file_status((filemgr *)0x156320);
  if ((ndocs._7_1_ == '\x04') && ((status_local[0x158] & 1) == 0)) {
    lVar2 = -((ulong)*(uint *)(status_local + 0x74) + 0xf & 0xfffffffffffffff0);
    __src = status_local + 0x70;
    pcVar3 = filename + lVar2 + -0x10;
    builtin_strncpy(filename + lVar2 + -0x10,"{c\x15",4);
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    memcpy(filename + 0x3f8,__src,0xf8);
    if (status_local[0x9e] == '\x01') {
      pcVar1 = *(char **)(status_local + 0x1c0);
      pcVar4 = filename + lVar2 + -0x10;
      pcVar4[0] = -0x5a;
      pcVar4[1] = 'c';
      pcVar4[2] = '\x15';
      pcVar4[3] = '\0';
      pcVar4[4] = '\0';
      pcVar4[5] = '\0';
      pcVar4[6] = '\0';
      pcVar4[7] = '\0';
      strcpy(local_5b8,pcVar1);
      pcVar5 = filename + lVar2 + -0x10;
      pcVar5[0] = -0x45;
      pcVar5[1] = 'c';
      pcVar5[2] = '\x15';
      pcVar5[3] = '\0';
      pcVar5[4] = '\0';
      pcVar5[5] = '\0';
      pcVar5[6] = '\0';
      pcVar5[7] = '\0';
      fstatus = filemgr_fhandle_remove
                          (*(filemgr **)(filename + lVar2 + 0x30),
                           *(void **)(filename + lVar2 + 0x28));
      pcVar6 = filename + lVar2 + -0x10;
      pcVar6[0] = -0x37;
      pcVar6[1] = 'c';
      pcVar6[2] = '\x15';
      pcVar6[3] = '\0';
      pcVar6[4] = '\0';
      pcVar6[5] = '\0';
      pcVar6[6] = '\0';
      pcVar6[7] = '\0';
      local_50 = _fdb_close(*(fdb_kvs_handle **)(filename + lVar2 + 8));
      if (local_50 != FDB_RESULT_SUCCESS) {
        if ((fstatus & 1) != 0) {
          pcVar7 = filename + lVar2 + -0x10;
          pcVar7[0] = -0x13;
          pcVar7[1] = 'c';
          pcVar7[2] = '\x15';
          pcVar7[3] = '\0';
          pcVar7[4] = '\0';
          pcVar7[5] = '\0';
          pcVar7[6] = '\0';
          pcVar7[7] = '\0';
          filemgr_fhandle_add(*(filemgr **)(filename + lVar2 + 0x30),
                              *(void **)(filename + lVar2 + 0x28));
        }
        return local_50;
      }
      pcVar8 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,"\x11d\x15",4);
      pcVar8[4] = '\0';
      pcVar8[5] = '\0';
      pcVar8[6] = '\0';
      pcVar8[7] = '\0';
      local_50 = _fdb_open(*(fdb_kvs_handle **)(&stack0x000016e8 + lVar2),
                           *(char **)(&stack0x000016e0 + lVar2),
                           *(fdb_filename_mode_t *)(&stack0x000016dc + lVar2),
                           *(fdb_config **)(&stack0x000016d0 + lVar2));
      if (local_50 != FDB_RESULT_SUCCESS) {
        return local_50;
      }
      pcVar9 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,":d\x15",4);
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      filemgr_fhandle_add(*(filemgr **)(filename + lVar2 + 0x30),*(void **)(filename + lVar2 + 0x28)
                         );
    }
    else {
      pcVar10 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,"ed\x15",4);
      pcVar10[4] = '\0';
      pcVar10[5] = '\0';
      pcVar10[6] = '\0';
      pcVar10[7] = '\0';
      filemgr_get_header(*(filemgr **)(filename + lVar2 + 0x20),*(void **)(filename + lVar2 + 0x18),
                         *(size_t **)(filename + lVar2 + 0x10),*(bid_t **)(filename + lVar2 + 8),
                         *(fdb_seqnum_t **)(filename + lVar2),
                         *(filemgr_header_revnum_t **)(local_5b8 + lVar2));
      *(uint64_t **)((long)alStackY_600 + lVar2 + 8) = &datasize;
      *(uint64_t **)((long)alStackY_600 + lVar2 + 0x10) = &last_wal_flush_hdr_bid;
      *(uint64_t **)((long)alStackY_600 + lVar2 + 0x18) = &nlivenodes;
      *(uint64_t **)((long)alStackY_600 + lVar2 + 0x20) = &kv_info_offset;
      *(uint64_t **)((long)alStackY_600 + lVar2 + 0x28) = &header_flags;
      *(size_t **)((long)alStackY_600 + lVar2 + 0x30) = &header_len;
      *(uint8_t ***)((long)alStackY_600 + lVar2 + 0x38) = &buf;
      pcVar1 = filename + lVar2 + -0x10;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      *(undefined8 *)((long)alStackY_600 + lVar2) = 0x1564ed;
      fdb_fetch_header(*(uint64_t *)(filename + lVar2 + -0x10),
                       *(void **)((long)alStackY_600 + lVar2 + 0x38),
                       *(bid_t **)((long)alStackY_600 + lVar2 + 0x30),
                       *(bid_t **)((long)alStackY_600 + lVar2 + 0x28),
                       *(bid_t **)((long)alStackY_600 + lVar2 + 0x20),
                       *(uint64_t **)((long)alStackY_600 + lVar2 + 0x18),
                       *(uint64_t **)(filename + lVar2),*(uint64_t **)(filename + lVar2 + 8),
                       *(uint64_t **)(filename + lVar2 + 0x10),
                       *(uint64_t **)(filename + lVar2 + 0x18),
                       *(uint64_t **)(filename + lVar2 + 0x20),
                       *(uint64_t **)(filename + lVar2 + 0x28),*(char ***)(filename + lVar2 + 0x30),
                       *(char ***)(filename + lVar2 + 0x38));
      pcVar11 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,"\x06e\x15",4);
      pcVar11[4] = '\0';
      pcVar11[5] = '\0';
      pcVar11[6] = '\0';
      pcVar11[7] = '\0';
      fstatus = filemgr_fhandle_remove
                          (*(filemgr **)(filename + lVar2 + 0x30),
                           *(void **)(filename + lVar2 + 0x28));
      pcVar12 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,"\x14e\x15",4);
      pcVar12[4] = '\0';
      pcVar12[5] = '\0';
      pcVar12[6] = '\0';
      pcVar12[7] = '\0';
      local_50 = _fdb_close(*(fdb_kvs_handle **)(filename + lVar2 + 8));
      if (local_50 != FDB_RESULT_SUCCESS) {
        if ((fstatus & 1) != 0) {
          pcVar13 = filename + lVar2 + -0x10;
          builtin_strncpy(filename + lVar2 + -0x10,"8e\x15",4);
          pcVar13[4] = '\0';
          pcVar13[5] = '\0';
          pcVar13[6] = '\0';
          pcVar13[7] = '\0';
          filemgr_fhandle_add(*(filemgr **)(filename + lVar2 + 0x30),
                              *(void **)(filename + lVar2 + 0x28));
        }
        return local_50;
      }
      pcVar14 = filename + lVar2 + -0x10;
      builtin_strncpy(filename + lVar2 + -0x10,"\\e\x15",4);
      pcVar14[4] = '\0';
      pcVar14[5] = '\0';
      pcVar14[6] = '\0';
      pcVar14[7] = '\0';
      local_50 = _fdb_open(*(fdb_kvs_handle **)(&stack0x000016e8 + lVar2),
                           *(char **)(&stack0x000016e0 + lVar2),
                           *(fdb_filename_mode_t *)(&stack0x000016dc + lVar2),
                           *(fdb_config **)(&stack0x000016d0 + lVar2));
      if (local_50 != FDB_RESULT_SUCCESS) {
        return local_50;
      }
      pcVar15 = filename + lVar2 + -0x10;
      pcVar15[0] = -0x7e;
      pcVar15[1] = 'e';
      pcVar15[2] = '\x15';
      pcVar15[3] = '\0';
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      filemgr_fhandle_add(*(filemgr **)(filename + lVar2 + 0x30),*(void **)(filename + lVar2 + 0x28)
                         );
    }
  }
  if (_fs != (file_status_t *)0x0) {
    *_fs = ndocs._7_1_;
  }
  return local_50;
}

Assistant:

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle, file_status_t *status)
{
    bool fhandle_ret;
    fdb_status fs = FDB_RESULT_SUCCESS;
    file_status_t fstatus = filemgr_get_file_status(handle->file);
    // check whether the compaction is done
    if ( fstatus == FILE_REMOVED_PENDING &&
         !handle->config.do_not_move_to_compacted_file ) {
        uint64_t ndocs, ndeletes, datasize, nlivenodes, last_wal_flush_hdr_bid;
        uint64_t kv_info_offset, header_flags;
        size_t header_len;
        char *new_filename;
        uint8_t *buf = alca(uint8_t, handle->config.blocksize);
        bid_t trie_root_bid, seq_root_bid, stale_root_bid;
        fdb_config config = handle->config;

        // close the current file and newly open the new file
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // compaction daemon mode .. just close and then open
            char filename[FDB_MAX_FILENAME_LEN];
            strcpy(filename, handle->filename);

            // We don't need to maintain fhandle list for the old file
            // as there will be no more mutation on the file.
            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, filename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);

        } else {
            // Manual compaction.
            filemgr_get_header(handle->file, buf, &header_len, NULL, NULL, NULL);
            fdb_fetch_header(handle->file->version, buf,
                             &trie_root_bid, &seq_root_bid, &stale_root_bid,
                             &ndocs, &ndeletes, &nlivenodes, &datasize,
                             &last_wal_flush_hdr_bid,
                             &kv_info_offset, &header_flags,
                             &new_filename, NULL);

            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, new_filename, FDB_AFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);
        }
    }
    if (status) {
        *status = fstatus;
    }
    return fs;
}